

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

void free_D_Scope(D_Scope *st,int force)

{
  D_Scope *pDVar1;
  D_Sym *pDVar2;
  D_Sym *sym;
  D_Scope *s;
  int force_local;
  D_Scope *st_local;
  
  while (st->down != (D_Scope *)0x0) {
    pDVar1 = st->down->down_next;
    free_D_Scope(st->down,0);
    st->down = pDVar1;
  }
  if (((*(byte *)st >> 2 & 1) == 0) || (force != 0)) {
    if (st->hash == (D_SymHash *)0x0) {
      while (st->ll != (D_Sym *)0x0) {
        pDVar2 = st->ll->next;
        free_D_Sym(st->ll);
        st->ll = pDVar2;
      }
    }
    else {
      free_D_SymHash(st->hash);
    }
    while (st->updates != (D_Sym *)0x0) {
      pDVar2 = st->updates->next;
      free_D_Sym(st->updates);
      st->updates = pDVar2;
    }
    free(st);
  }
  return;
}

Assistant:

void free_D_Scope(D_Scope *st, int force) {
  D_Scope *s;
  D_Sym *sym;
  for (; st->down; st->down = s) {
    s = st->down->down_next;
    free_D_Scope(st->down, 0);
  }
  if (st->owned_by_user && !force) return;
  if (st->hash)
    free_D_SymHash(st->hash);
  else
    for (; st->ll; st->ll = sym) {
      sym = st->ll->next;
      free_D_Sym(st->ll);
    }
  for (; st->updates; st->updates = sym) {
    sym = st->updates->next;
    free_D_Sym(st->updates);
  }
  FREE(st);
}